

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

void __thiscall
ot::commissioner::coap::Coap::FinalizeTransaction
          (Coap *this,RequestHolder *aRequestHolder,Response *aResponse,Error *aResult)

{
  bool bVar1;
  Error local_70;
  undefined1 local_48 [8];
  ResponseHandler handler;
  Error *aResult_local;
  Response *aResponse_local;
  RequestHolder *aRequestHolder_local;
  Coap *this_local;
  
  handler._M_invoker = (_Invoker_type)aResult;
  bVar1 = std::operator!=(&aRequestHolder->mHandler,(nullptr_t)0x0);
  if (bVar1) {
    std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::function
              ((function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)> *)
               local_48,&aRequestHolder->mHandler);
    std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
    operator=(&aRequestHolder->mHandler,(nullptr_t)0x0);
    Error::Error(&local_70,aResult);
    std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
    operator()((function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)> *)
               local_48,aResponse,&local_70);
    Error::~Error(&local_70);
    std::function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
    ~function((function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)> *)
              local_48);
  }
  RequestsCache::Eliminate(&this->mRequestsCache,aRequestHolder);
  return;
}

Assistant:

void Coap::FinalizeTransaction(const RequestHolder &aRequestHolder, const Response *aResponse, Error aResult)
{
    if (aRequestHolder.mHandler != nullptr)
    {
        auto handler = aRequestHolder.mHandler;

        // The user-provided handler may do anything that causing this
        // handler be recursively called (For example, user stops the CoAP
        // instance which will finalize all transactions). Set this handler
        // to null to stop a handler being recalled.
        aRequestHolder.mHandler = nullptr;
        handler(aResponse, aResult);
    }
    mRequestsCache.Eliminate(aRequestHolder);
}